

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::AssertSnapEquiv
               (SnapPrimitiveValue *v1,SnapPrimitiveValue *v2,TTDCompareMap *compareMap)

{
  char16_t *string1;
  char16_t *string2;
  int iVar1;
  bool bVar2;
  
  TTDCompareMap::DiagnosticAssert(compareMap,v1->SnapType->JsTypeId == v2->SnapType->JsTypeId);
  NSSnapType::AssertSnapEquiv(v1->SnapType,v2->SnapType,compareMap);
  if (v1->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) {
    if (v2->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) {
      switch(v1->SnapType->JsTypeId) {
      case TypeIds_Undefined:
      case TypeIds_Null:
        return;
      case TypeIds_Boolean:
        bVar2 = ((v2->field_3).u_boolValue == 0) != ((v1->field_3).u_boolValue != 0);
        break;
      default:
        TTDAbort_unrecoverable_error
                  ("These are supposed to be primitive values e.g., no pointers or properties.");
      case TypeIds_Number:
        bVar2 = CheckSnapEquivTTDDouble((v1->field_3).u_doubleValue,(v2->field_3).u_doubleValue);
        break;
      case TypeIds_Int64Number:
      case TypeIds_LastNumberType:
        bVar2 = (v1->field_3).u_int64Value == (v2->field_3).u_int64Value;
        break;
      case TypeIds_String:
        bVar2 = TTStringEQForDiagnostics((v1->field_3).u_stringValue,(v2->field_3).u_stringValue);
        break;
      case TypeIds_Symbol:
        bVar2 = (v1->field_3).u_boolValue == (v2->field_3).u_boolValue;
      }
      goto LAB_0093bcca;
    }
    bVar2 = false;
  }
  else {
    bVar2 = v2->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar2);
  string1 = v1->OptWellKnownToken;
  string2 = v2->OptWellKnownToken;
  if (string1 == string2) {
    bVar2 = true;
  }
  else if (string2 == (char16_t *)0x0 || string1 == (char16_t *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = PAL_wcscmp(string1,string2);
    bVar2 = iVar1 == 0;
  }
LAB_0093bcca:
  TTDCompareMap::DiagnosticAssert(compareMap,bVar2);
  return;
}

Assistant:

void AssertSnapEquiv(const SnapPrimitiveValue* v1, const SnapPrimitiveValue* v2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(v1->SnapType->JsTypeId == v2->SnapType->JsTypeId);

            NSSnapType::AssertSnapEquiv(v1->SnapType, v2->SnapType, compareMap);

            if(v1->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN || v2->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                compareMap.DiagnosticAssert(v1->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN && v2->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN);
                compareMap.DiagnosticAssert(TTD_DIAGNOSTIC_COMPARE_WELLKNOWN_TOKENS(v1->OptWellKnownToken, v2->OptWellKnownToken));
            }
            else
            {
                switch(v1->SnapType->JsTypeId)
                {
                case Js::TypeIds_Undefined:
                case Js::TypeIds_Null:
                    break;
                case Js::TypeIds_Boolean:
                    compareMap.DiagnosticAssert((!!v1->u_boolValue) == (!!v2->u_boolValue));
                    break;
                case Js::TypeIds_Number:
                    compareMap.DiagnosticAssert(CheckSnapEquivTTDDouble(v1->u_doubleValue, v2->u_doubleValue));
                    break;
                case Js::TypeIds_Int64Number:
                    compareMap.DiagnosticAssert(v1->u_int64Value == v2->u_int64Value);
                    break;
                case Js::TypeIds_UInt64Number:
                    compareMap.DiagnosticAssert(v1->u_uint64Value == v2->u_uint64Value);
                    break;
                case Js::TypeIds_String:
                    compareMap.DiagnosticAssert(TTStringEQForDiagnostics(*(v1->u_stringValue), *(v2->u_stringValue)));
                    break;
                case Js::TypeIds_Symbol:
                    compareMap.DiagnosticAssert(v1->u_propertyIdValue == v2->u_propertyIdValue);
                    break;
                default:
                    TTDAssert(false, "These are supposed to be primitive values e.g., no pointers or properties.");
                    break;
                }
            }
        }